

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

void al_join_thread(ALLEGRO_THREAD *thread,void **ret_value)

{
  THREAD_STATE TVar1;
  
  while (TVar1 = thread->thread_state, TVar1 == THREAD_STATE_STARTING) {
    al_rest(0.001);
  }
  if ((TVar1 == THREAD_STATE_CREATED) || (TVar1 == THREAD_STATE_STARTED)) {
    if ((thread->mutex).inited == true) {
      pthread_mutex_lock((pthread_mutex_t *)&(thread->mutex).mutex);
    }
    thread->thread_state = THREAD_STATE_JOINING;
    pthread_cond_broadcast((pthread_cond_t *)&thread->cond);
    if ((thread->mutex).inited == true) {
      pthread_mutex_unlock((pthread_mutex_t *)&(thread->mutex).mutex);
    }
    pthread_cond_destroy((pthread_cond_t *)&thread->cond);
    _al_mutex_destroy(&thread->mutex);
    _al_thread_join(&thread->thread);
    thread->thread_state = THREAD_STATE_JOINED;
  }
  if (ret_value != (void **)0x0) {
    *ret_value = thread->retval;
  }
  return;
}

Assistant:

void al_join_thread(ALLEGRO_THREAD *thread, void **ret_value)
{
   ASSERT(thread);

   /* If al_join_thread() is called soon after al_start_thread(), the thread
    * function may not yet have noticed the STARTING state and executed the
    * user's thread function.  Hence we must wait until the thread enters the
    * STARTED state.
    */
   while (thread->thread_state == THREAD_STATE_STARTING) {
      al_rest(0.001);
   }

   switch (thread->thread_state) {
      case THREAD_STATE_CREATED: /* fall through */
      case THREAD_STATE_STARTED:
         _al_mutex_lock(&thread->mutex);
         thread->thread_state = THREAD_STATE_JOINING;
         _al_cond_broadcast(&thread->cond);
         _al_mutex_unlock(&thread->mutex);
         _al_cond_destroy(&thread->cond);
         _al_mutex_destroy(&thread->mutex);
         _al_thread_join(&thread->thread);
         thread->thread_state = THREAD_STATE_JOINED;
         break;
      case THREAD_STATE_STARTING:
         ASSERT(thread->thread_state != THREAD_STATE_STARTING);
         break;
      case THREAD_STATE_JOINING:
         ASSERT(thread->thread_state != THREAD_STATE_JOINING);
         break;
      case THREAD_STATE_JOINED:
         ASSERT(thread->thread_state != THREAD_STATE_JOINED);
         break;
      case THREAD_STATE_DESTROYED:
         ASSERT(thread->thread_state != THREAD_STATE_DESTROYED);
         break;
      case THREAD_STATE_DETACHED:
         ASSERT(thread->thread_state != THREAD_STATE_DETACHED);
         break;
   }

   if (ret_value) {
      *ret_value = thread->retval;
   }
}